

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_resampler_uninit(ma_resampler *pResampler,ma_allocation_callbacks *pAllocationCallbacks)

{
  _func_void_void_ptr_ma_resampling_backend_ptr_ma_allocation_callbacks_ptr *p_Var1;
  
  if (((pResampler != (ma_resampler *)0x0) &&
      (pResampler->pBackendVTable != (ma_resampling_backend_vtable *)0x0)) &&
     (p_Var1 = pResampler->pBackendVTable->onUninit,
     p_Var1 != (_func_void_void_ptr_ma_resampling_backend_ptr_ma_allocation_callbacks_ptr *)0x0)) {
    (*p_Var1)(pResampler->pBackendUserData,pResampler->pBackend,pAllocationCallbacks);
    if (pResampler->_ownsHeap != 0) {
      ma_free(pResampler->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_resampler_uninit(ma_resampler* pResampler, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pResampler == NULL) {
        return;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onUninit == NULL) {
        return;
    }

    pResampler->pBackendVTable->onUninit(pResampler->pBackendUserData, pResampler->pBackend, pAllocationCallbacks);

    if (pResampler->_ownsHeap) {
        ma_free(pResampler->_pHeap, pAllocationCallbacks);
    }
}